

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_bigint_sub.c
# Opt level: O1

int main(void)

{
  int iVar1;
  _PDCLIB_bigint_t res;
  _PDCLIB_bigint_t rhs;
  _PDCLIB_bigint_t lhs;
  _PDCLIB_bigint_t local_1a8;
  _PDCLIB_bigint_t local_120;
  _PDCLIB_bigint_t local_98;
  
  local_98.data[0] = 0xffff;
  local_120.data[0] = 0x8000;
  local_120.data[1] = 0;
  local_120.data[2] = 0x8001;
  local_120.data[3] = 0;
  local_1a8.data[0] = 0x7fff;
  local_1a8.data[1] = 0;
  local_98.data[1] = 0;
  local_98.data[2] = 0;
  local_1a8.data[2] = 0x7fff;
  local_1a8.data[3] = 0xffff;
  local_1a8.data[4] = 0;
  local_1a8.data[5] = 0x7fff;
  local_98.data[3] = 0;
  local_98.data[4] = 0;
  local_98.data[5] = 0;
  local_98.data[6] = 0x7fff;
  local_120.data[4] = 0xffff;
  local_120.data[5] = 0x8000;
  local_120.data[6] = 0xffff;
  local_120.data[7] = 0x8000;
  local_1a8.data[6] = 0x7fff;
  local_1a8.data[7] = 0xffff;
  local_1a8.data[8] = 0;
  local_1a8.data[9] = 0x8001;
  local_98.data[7] = 0x8000;
  local_98.data[8] = 0x8001;
  local_98.data[9] = 0x8000;
  local_98.data[10] = 0x8000;
  local_120.data[8] = 0x8000;
  local_120.data[9] = 0xffff;
  local_120.data[10] = 0;
  local_120.data[0xb] = 0x8001;
  local_1a8.data[10] = 0x7fff;
  local_1a8.data[0xb] = 0xffff;
  local_98.data[0xb] = 0x8000;
  local_98.data[0xc] = 0x8001;
  local_1a8.data[0xc] = 0x8000;
  local_98.size = 0xd;
  local_120.size = 0xc;
  local_1a8.size = 0xd;
  _PDCLIB_bigint_sub(&local_98,&local_120);
  iVar1 = _PDCLIB_bigint_cmp(&local_98,&local_1a8);
  if (iVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_bigint_sub.c, line %d - %s\n"
           ,0x6b,"_PDCLIB_bigint_cmp( _PDCLIB_bigint_sub( &lhs, &rhs ), &res ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    _PDCLIB_bigint_t lhs, rhs, res;
    _PDCLIB_bigint_digit_t NUL = 0;
    _PDCLIB_bigint_digit_t SML = _PDCLIB_BIGINT_DIGIT_MAX / 2;
    _PDCLIB_bigint_digit_t MID = _PDCLIB_BIGINT_DIGIT_MAX / 2 + 1;
    _PDCLIB_bigint_digit_t LRG = _PDCLIB_BIGINT_DIGIT_MAX / 2 + 2;
    _PDCLIB_bigint_digit_t MAX = _PDCLIB_BIGINT_DIGIT_MAX;

    /* Building a large number substraction that covers all kinds of
       cases. From rightmost digit to left:
    */
    /* carry 0, lhs '9', rhs '5', newcarry 0, result '4' */
    lhs.data[0] = MAX; rhs.data[0] = MID; res.data[0] = SML;
    /* carry 0, lhs '0', rhs '0', newcarry 0, result '0' */
    lhs.data[1] = NUL; rhs.data[1] = NUL; res.data[1] = NUL;
    /* carry 0, lhs '0', rhs '6', newcarry 1, result '4' */
    lhs.data[2] = NUL; rhs.data[2] = LRG; res.data[2] = SML;
    /* carry 1, lhs '0', rhs '0', newcarry 1, result '9' */
    lhs.data[3] = NUL; rhs.data[3] = NUL; res.data[3] = MAX;
    /* carry 1, lhs '0', rhs '9', newcarry 1, result '0' */
    lhs.data[4] = NUL; rhs.data[4] = MAX; res.data[4] = NUL;
    /* carry 1, lhs '0', rhs '5', newcarry 1, result '4' */
    lhs.data[5] = NUL; rhs.data[5] = MID; res.data[5] = SML;
    /* carry 1, lhs '4', rhs '9', newcarry 1, result '4' */
    lhs.data[6] = SML; rhs.data[6] = MAX; res.data[6] = SML;
    /* carry 1, lhs '5', rhs '5', newcarry 1, result '9' */
    lhs.data[7] = MID; rhs.data[7] = MID; res.data[7] = MAX;
    /* carry 1, lhs '6', rhs '5', newcarry 0, result '0' */
    lhs.data[8] = LRG; rhs.data[8] = MID; res.data[8] = NUL;
    /* carry 0, lhs '5', rhs '9', newcarry 1, result '6' */
    lhs.data[9] = MID; rhs.data[9] = MAX; res.data[9] = LRG;
    /* carry 1, lhs '5', rhs '0', newcarry 0, result '4' */
    lhs.data[10] = MID; rhs.data[10] = NUL; res.data[10] = SML;
    /* carry 0, lhs '5', rhs '6', newcarry 1, result '9' */
    lhs.data[11] = MID; rhs.data[11] = LRG; res.data[11] = MAX;
    /* carry 1, lhs '6', rhs ---, newcarry 0, result '5' */
    lhs.data[12] = LRG; res.data[12] = MID;
    lhs.size = 13; rhs.size = 12; res.size = 13;
    TESTCASE( _PDCLIB_bigint_cmp( _PDCLIB_bigint_sub( &lhs, &rhs ), &res ) == 0 );
#endif
    return TEST_RESULTS;
}